

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

char * ODDLParser::OpenDDLParser::parseStringLiteral(char *in,char *end,Value **stringData)

{
  Value *pVVar1;
  size_t len;
  char *pcVar2;
  
  *stringData = (Value *)0x0;
  if (in != end && in != (char *)0x0) {
    in = lookForNextToken<char>(in,end);
    if (*in == '\"') {
      len = 0;
      for (pcVar2 = in + 1; (pcVar2 != end && (*pcVar2 != '\"')); pcVar2 = pcVar2 + 1) {
        len = len + 1;
      }
      pVVar1 = ValueAllocator::allocPrimData(ddl_string,len);
      *stringData = pVVar1;
      strncpy((char *)pVVar1->m_data,in + 1,len);
      (*stringData)->m_data[len] = '\0';
      in = pcVar2 + 1;
    }
  }
  return in;
}

Assistant:

char *OpenDDLParser::parseStringLiteral( char *in, char *end, Value **stringData ) {
    *stringData = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    size_t len( 0 );
    char *start( in );
    if( *start == '\"' ) {
        ++start;
        ++in;
        while( *in != '\"' && in != end ) {
            ++in;
            ++len;
        }

        *stringData = ValueAllocator::allocPrimData( Value::ddl_string, len );
        ::strncpy( ( char* ) ( *stringData )->m_data, start, len );
        ( *stringData )->m_data[len] = '\0';
        ++in;
    }

    return in;
}